

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestWithCustomGenerator.cpp
# Opt level: O3

void __thiscall PropTestCustomGen::PropTestCustomGen(PropTestCustomGen *this)

{
  Generator<Rectangle> local_10;
  
  local_10.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl =
       (unique_ptr<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
        )operator_new(0x10);
  *(undefined ***)
   local_10.m_gen._M_t.
   super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
   .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl =
       &PTR__GenConcept_0010aca8;
  (this->
  super_Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  ).super_PropertyBase._vptr_PropertyBase = (_func_int **)&PTR_expect_0010ad08;
  cppqc::tupleOf<Rectangle>
            ((cppqc *)&(this->
                       super_Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                       ).m_gen,&local_10);
  if (local_10.m_gen._M_t.
      super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
      .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_10.m_gen._M_t.
                          super___uniq_ptr_impl<cppqc::detail::GenConcept<Rectangle>,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_std::default_delete<cppqc::detail::GenConcept<Rectangle>_>_>
                          .super__Head_base<0UL,_cppqc::detail::GenConcept<Rectangle>_*,_false>.
                          _M_head_impl + 8))();
  }
  (this->
  super_Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  ).super_PropertyBase._vptr_PropertyBase = (_func_int **)&PTR_expect_0010ac20;
  return;
}

Assistant:

PropTestCustomGen() : Property(CustomGenerator()) {}